

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

Pdr_Obl_t * Pdr_QueuePop(Pdr_Man_t *p)

{
  Pdr_Obl_t *pRes;
  Pdr_Man_t *p_local;
  
  p_local = (Pdr_Man_t *)p->pQueue;
  if (p->pQueue == (Pdr_Obl_t *)0x0) {
    p_local = (Pdr_Man_t *)0x0;
  }
  else {
    p->pQueue = p->pQueue->pLink;
    Pdr_OblDeref((Pdr_Obl_t *)p_local);
    p->nQueCur = p->nQueCur + -1;
  }
  return (Pdr_Obl_t *)p_local;
}

Assistant:

Pdr_Obl_t * Pdr_QueuePop( Pdr_Man_t * p )
{
    Pdr_Obl_t * pRes = p->pQueue;
    if ( p->pQueue == NULL )
        return NULL;
    p->pQueue = p->pQueue->pLink;
    Pdr_OblDeref( pRes );
    p->nQueCur--;
    return pRes;
}